

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobVerificationManager.cxx
# Opt level: O2

void __thiscall
cmGlobVerificationManager::AddCacheEntry
          (cmGlobVerificationManager *this,bool recurse,bool listDirectories,bool followSymlinks,
          string *relative,string *expression,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *variable,cmListFileBacktrace *backtrace)

{
  pointer ppVar1;
  bool bVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  pointer ppVar5;
  CacheEntryKey key;
  ostringstream message;
  string sStack_248;
  string local_228;
  string local_208;
  CacheEntryKey local_1e8;
  undefined1 local_1a0 [376];
  
  std::__cxx11::string::string((string *)&local_228,(string *)relative);
  std::__cxx11::string::string((string *)&local_208,(string *)expression);
  CacheEntryKey::CacheEntryKey
            (&local_1e8,recurse,listDirectories,followSymlinks,&local_228,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  pmVar3 = std::
           map<cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue,_std::less<cmGlobVerificationManager::CacheEntryKey>,_std::allocator<std::pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>_>_>
           ::operator[](&this->Cache,&local_1e8);
  if (pmVar3->Initialized == false) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&pmVar3->Files,files);
    pmVar3->Initialized = true;
  }
  else {
    bVar2 = std::operator!=(&pmVar3->Files,files);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      *(uint *)(*(_func_int **)(local_1a0._0_8_ + -0x18) + (long)(local_1a0 + 0x18)) =
           *(uint *)(*(_func_int **)(local_1a0._0_8_ + -0x18) + (long)(local_1a0 + 0x18)) | 1;
      std::operator<<((ostream *)local_1a0,"The glob expression\n");
      CacheEntryKey::PrintGlobCommand(&local_1e8,(ostream *)local_1a0,variable);
      cmListFileBacktrace::PrintTitle(backtrace,(ostream *)local_1a0);
      std::operator<<((ostream *)local_1a0,
                      "\nwas already present in the glob cache but the directory\ncontents have changed during the configuration run.\n"
                     );
      std::operator<<((ostream *)local_1a0,"Matching glob expressions:");
      ppVar1 = (pmVar3->Backtraces).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar5 = (pmVar3->Backtraces).
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar1; ppVar5 = ppVar5 + 1
          ) {
        poVar4 = std::operator<<((ostream *)local_1a0,"\n  ");
        std::operator<<(poVar4,(string *)ppVar5);
        cmListFileBacktrace::PrintTitle(&ppVar5->second,(ostream *)local_1a0);
      }
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(&sStack_248);
      std::__cxx11::string::~string((string *)&sStack_248);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
      goto LAB_0027f7c3;
    }
  }
  std::
  vector<std::pair<std::__cxx11::string,cmListFileBacktrace>,std::allocator<std::pair<std::__cxx11::string,cmListFileBacktrace>>>
  ::emplace_back<std::__cxx11::string_const&,cmListFileBacktrace_const&>
            ((vector<std::pair<std::__cxx11::string,cmListFileBacktrace>,std::allocator<std::pair<std::__cxx11::string,cmListFileBacktrace>>>
              *)&pmVar3->Backtraces,variable,backtrace);
LAB_0027f7c3:
  CacheEntryKey::~CacheEntryKey(&local_1e8);
  return;
}

Assistant:

void cmGlobVerificationManager::AddCacheEntry(
  const bool recurse, const bool listDirectories, const bool followSymlinks,
  const std::string& relative, const std::string& expression,
  const std::vector<std::string>& files, const std::string& variable,
  const cmListFileBacktrace& backtrace)
{
  CacheEntryKey key = CacheEntryKey(recurse, listDirectories, followSymlinks,
                                    relative, expression);
  CacheEntryValue& value = this->Cache[key];
  if (!value.Initialized) {
    value.Files = files;
    value.Initialized = true;
    value.Backtraces.emplace_back(variable, backtrace);
  } else if (value.Initialized && value.Files != files) {
    std::ostringstream message;
    message << std::boolalpha;
    message << "The glob expression\n";
    key.PrintGlobCommand(message, variable);
    backtrace.PrintTitle(message);
    message << "\nwas already present in the glob cache but the directory\n"
               "contents have changed during the configuration run.\n";
    message << "Matching glob expressions:";
    for (auto const& bt : value.Backtraces) {
      message << "\n  " << std::get<0>(bt);
      std::get<1>(bt).PrintTitle(message);
    }
    cmSystemTools::Error(message.str());
  } else {
    value.Backtraces.emplace_back(variable, backtrace);
  }
}